

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

int __thiscall Indexing::ClauseCodeTree::ClauseMatcher::init(ClauseMatcher *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int extraout_EAX;
  LitInfo *pLVar3;
  byte in_CL;
  uint uVar4;
  Clause *in_RDX;
  uint newIndex;
  uint i_3;
  uint i_2;
  uint i_1;
  uint liIndex;
  uint liCnt;
  uint i;
  uint baseLICnt;
  uint clen;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  uint uVar5;
  size_t in_stack_ffffffffffffff40;
  DArray<Indexing::CodeTree::LitInfo> *in_stack_ffffffffffffff48;
  bool local_b0;
  uint local_a4;
  undefined8 local_a0;
  FlatTerm *local_98;
  bool local_90;
  undefined8 local_88;
  FlatTerm *local_80;
  bool local_78;
  uint local_6c;
  undefined8 local_68;
  undefined7 local_60;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  ClauseMatcher *in_stack_ffffffffffffffb0;
  FlatTerm *local_48;
  bool local_40;
  uint local_34;
  uint local_30;
  uint local_28;
  uint local_24;
  
  this->query = in_RDX;
  this->tree = (ClauseCodeTree *)ctx;
  this->sres = (bool)(in_CL & 1);
  Lib::
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  ::reset((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
           *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  uVar2 = Kernel::Clause::length(this->query);
  local_24 = uVar2;
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    Kernel::Clause::operator[](this->query,local_28);
    bVar1 = Kernel::Literal::isEquality((Literal *)0x2f68ac);
    if (bVar1) {
      local_24 = local_24 + 1;
    }
  }
  uVar5 = local_24;
  if ((this->sres & 1U) != 0) {
    uVar5 = local_24 << 1;
  }
  Lib::DArray<Indexing::CodeTree::LitInfo>::ensure
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  local_30 = 0;
  for (local_34 = 0; local_34 < uVar2; local_34 = local_34 + 1) {
    Kernel::Clause::operator[](this->query,local_34);
    bVar1 = Kernel::Term::ground((Term *)0x2f6965);
    uVar4 = local_30;
    if (bVar1) {
      CodeTree::LitInfo::LitInfo
                ((LitInfo *)CONCAT44(uVar5,in_stack_ffffffffffffff30),
                 (Clause *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24);
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
      *(ClauseMatcher **)pLVar3 = in_stack_ffffffffffffffb0;
      pLVar3->ft = local_48;
      pLVar3->opposite = local_40;
      in_stack_ffffffffffffff30 = local_30;
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
      pLVar3->liIndex = in_stack_ffffffffffffff30;
      uVar4 = local_30 + 1;
      Kernel::Clause::operator[](this->query,local_34);
      bVar1 = Kernel::Literal::isEquality((Literal *)0x2f6a1a);
      if (bVar1) {
        Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
        CodeTree::LitInfo::getReversed((LitInfo *)CONCAT44(uVar5,in_stack_ffffffffffffff30));
        pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar4);
        pLVar3->liIndex = (undefined4)local_68;
        pLVar3->litIndex = local_68._4_4_;
        pLVar3->ft = (FlatTerm *)CONCAT17(in_stack_ffffffffffffffa7,local_60);
        pLVar3->opposite = (bool)in_stack_ffffffffffffffa8;
        pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar4);
        pLVar3->liIndex = uVar4;
        in_stack_ffffffffffffff2c = uVar4;
        uVar4 = local_30 + 2;
      }
    }
    local_30 = uVar4;
  }
  for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 1) {
    Kernel::Clause::operator[](this->query,local_6c);
    bVar1 = Kernel::Term::ground((Term *)0x2f6b0a);
    uVar4 = local_30;
    if (!bVar1) {
      CodeTree::LitInfo::LitInfo
                ((LitInfo *)CONCAT44(uVar5,in_stack_ffffffffffffff30),
                 (Clause *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24);
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
      pLVar3->liIndex = (undefined4)local_88;
      pLVar3->litIndex = local_88._4_4_;
      pLVar3->ft = local_80;
      pLVar3->opposite = local_78;
      in_stack_ffffffffffffff28 = local_30;
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
      pLVar3->liIndex = in_stack_ffffffffffffff28;
      uVar4 = local_30 + 1;
      Kernel::Clause::operator[](this->query,local_6c);
      bVar1 = Kernel::Literal::isEquality((Literal *)0x2f6baf);
      if (bVar1) {
        Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_30);
        CodeTree::LitInfo::getReversed((LitInfo *)CONCAT44(uVar5,in_stack_ffffffffffffff30));
        pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar4);
        pLVar3->liIndex = (undefined4)local_a0;
        pLVar3->litIndex = local_a0._4_4_;
        pLVar3->ft = local_98;
        pLVar3->opposite = local_90;
        pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar4);
        pLVar3->liIndex = uVar4;
        in_stack_ffffffffffffff24 = uVar4;
        uVar4 = local_30 + 2;
      }
    }
    local_30 = uVar4;
  }
  if ((this->sres & 1U) != 0) {
    for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
      uVar2 = local_a4 + local_24;
      Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)local_a4);
      CodeTree::LitInfo::getOpposite((LitInfo *)CONCAT44(uVar5,in_stack_ffffffffffffff30));
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar2);
      pLVar3->liIndex = (int)in_stack_ffffffffffffff40;
      pLVar3->litIndex = (int)(in_stack_ffffffffffffff40 >> 0x20);
      pLVar3->ft = (FlatTerm *)in_stack_ffffffffffffff48;
      pLVar3->opposite = local_b0;
      pLVar3 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[](&this->lInfos,(ulong)uVar2);
      pLVar3->liIndex = uVar2;
    }
    this->sresLiteral = 0xffffffff;
  }
  CodeTree::incTimeStamp((CodeTree *)CONCAT44(uVar5,in_stack_ffffffffffffff30));
  CodeTree::getEntryPoint((CodeTree *)0x2f6d39);
  enterLiteral(in_stack_ffffffffffffffb0,
               (CodeOp *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
               (bool)in_stack_ffffffffffffffa7);
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::init(ClauseCodeTree* tree_, Clause* query_, bool sres_)
{
  ASS(!tree_->isEmpty());

  query=query_;
  tree=tree_;
  sres=sres_;
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,0);
  tree->_clauseMatcherCounter++;
#endif

  //init LitInfo records
  unsigned clen=query->length();
  unsigned baseLICnt=clen;
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->isEquality()) {
      baseLICnt++;
    }
  }
  unsigned liCnt=sres ? (baseLICnt*2) : baseLICnt;
  lInfos.ensure(liCnt);

  //we put ground literals first
  unsigned liIndex=0;
  for(unsigned i=0;i<clen;i++) {
    if(!(*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  if(sres) {
    for(unsigned i=0;i<baseLICnt;i++) {
      unsigned newIndex=i+baseLICnt;
      lInfos[newIndex]=LitInfo::getOpposite(lInfos[i]);
      lInfos[newIndex].liIndex=newIndex;
    }
    sresLiteral=sresNoLiteral;
  }

  tree->incTimeStamp();
  enterLiteral(tree->getEntryPoint(), clen==0);
}